

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

void __thiscall
gl4cts::GPUShaderFP64Test9::getMatrixMultiplicationResult
          (GPUShaderFP64Test9 *this,_variable_type *matrix_a_type,
          vector<double,_std::allocator<double>_> *matrix_a_data,_variable_type *matrix_b_type,
          vector<double,_std::allocator<double>_> *matrix_b_data,double *out_result_ptr)

{
  const_reference pvVar1;
  double *pdVar2;
  TestError *this_00;
  Matrix<double,_2,_2> *mat;
  Matrix<double,_2,_2> *mat_00;
  Matrix<double,_2,_3> *mat_01;
  Matrix<double,_3,_2> *mat_02;
  Matrix<double,_2,_4> *mat_03;
  Matrix<double,_4,_2> *mat_04;
  Matrix<double,_3,_3> *mat_05;
  Matrix<double,_3,_3> *mat_06;
  Matrix<double,_3,_2> *mat_07;
  Matrix<double,_2,_3> *mat_08;
  Matrix<double,_3,_4> *mat_09;
  Matrix<double,_4,_3> *mat_10;
  Matrix<double,_4,_4> *mat_11;
  Matrix<double,_4,_4> *mat_12;
  Matrix<double,_4,_2> *mat_13;
  Matrix<double,_2,_4> *mat_14;
  Matrix<double,_4,_3> *mat_15;
  Matrix<double,_3,_4> *mat_16;
  Array<double,_9> local_15d0;
  Matrix<double,_3,_3> local_1588;
  Matrix<double,_4,_3> local_1540;
  Matrix<double,_3,_4> local_14e0;
  undefined1 local_1480 [8];
  Matrix<double,_3,_3> result_8;
  Matrix<double,_4,_3> matrix_b_transposed_5;
  Matrix<double,_3,_4> matrix_b_8;
  Matrix<double,_3,_4> matrix_a_transposed_5;
  Matrix<double,_4,_3> matrix_a_8;
  Matrix<double,_2,_2> local_1298;
  Matrix<double,_4,_2> local_1278;
  Matrix<double,_2,_4> local_1238;
  undefined1 local_11f8 [8];
  Matrix<double,_2,_2> result_7;
  Matrix<double,_4,_2> matrix_b_transposed_4;
  Matrix<double,_2,_4> matrix_b_7;
  Matrix<double,_2,_4> matrix_a_transposed_4;
  Matrix<double,_4,_2> matrix_a_7;
  Matrix<double,_4,_4> local_1058;
  Matrix<double,_4,_4> local_fd8;
  Matrix<double,_4,_4> local_f58;
  undefined1 local_ed8 [8];
  Matrix<double,_4,_4> result_6;
  Matrix<double,_4,_4> matrix_b_6;
  Matrix<double,_4,_4> matrix_a_6;
  Matrix<double,_4,_4> local_cd8;
  Matrix<double,_3,_4> local_c58;
  Matrix<double,_4,_3> local_bf8;
  undefined1 local_b98 [8];
  Matrix<double,_4,_4> result_5;
  Matrix<double,_3,_4> matrix_b_transposed_3;
  Matrix<double,_4,_3> matrix_b_5;
  Matrix<double,_4,_3> matrix_a_transposed_3;
  Matrix<double,_3,_4> matrix_a_5;
  Matrix<double,_2,_2> local_978;
  Matrix<double,_3,_2> local_958;
  Matrix<double,_2,_3> local_928;
  undefined1 local_8f8 [8];
  Matrix<double,_2,_2> result_4;
  Matrix<double,_3,_2> matrix_b_transposed_2;
  Matrix<double,_2,_3> matrix_b_4;
  Matrix<double,_2,_3> matrix_a_transposed_2;
  Matrix<double,_3,_2> matrix_a_4;
  Matrix<double,_3,_3> local_7d0;
  Matrix<double,_3,_3> local_788;
  Matrix<double,_3,_3> local_740;
  undefined1 local_6f8 [8];
  Matrix<double,_3,_3> result_3;
  Matrix<double,_3,_3> matrix_b_3;
  Matrix<double,_3,_3> matrix_a_3;
  Matrix<double,_4,_4> local_5a0;
  Matrix<double,_2,_4> local_520;
  Matrix<double,_4,_2> local_4e0;
  undefined1 local_4a0 [8];
  Matrix<double,_4,_4> result_2;
  Matrix<double,_2,_4> matrix_b_transposed_1;
  Matrix<double,_4,_2> matrix_b_2;
  Matrix<double,_4,_2> matrix_a_transposed_1;
  Matrix<double,_2,_4> matrix_a_2;
  Matrix<double,_3,_3> local_2d8;
  Matrix<double,_2,_3> local_290;
  Matrix<double,_3,_2> local_260;
  undefined1 local_230 [8];
  Matrix<double,_3,_3> result_1;
  Matrix<double,_2,_3> matrix_b_transposed;
  Matrix<double,_3,_2> matrix_b_1;
  Matrix<double,_3,_2> matrix_a_transposed;
  Matrix<double,_2,_3> matrix_a_1;
  Matrix<double,_2,_2> local_108;
  Matrix<double,_2,_2> local_e8;
  Matrix<double,_2,_2> local_c8;
  undefined1 local_a8 [8];
  Matrix2d result;
  undefined1 local_78 [8];
  Matrix2d matrix_b;
  Matrix2d matrix_a;
  double *out_result_ptr_local;
  vector<double,_std::allocator<double>_> *matrix_b_data_local;
  _variable_type *matrix_b_type_local;
  vector<double,_std::allocator<double>_> *matrix_a_data_local;
  _variable_type *matrix_a_type_local;
  GPUShaderFP64Test9 *this_local;
  
  switch(*matrix_a_type) {
  case VARIABLE_TYPE_DMAT2:
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](matrix_a_data,0);
    tcu::Matrix<double,_2,_2>::Matrix
              ((Matrix<double,_2,_2> *)(matrix_b.m_data.m_data[1].m_data + 1),pvVar1);
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](matrix_b_data,0);
    tcu::Matrix<double,_2,_2>::Matrix((Matrix<double,_2,_2> *)local_78,pvVar1);
    tcu::Matrix<double,_2,_2>::Matrix((Matrix<double,_2,_2> *)local_a8);
    tcu::transpose<double,2,2>(&local_c8,(tcu *)(matrix_b.m_data.m_data[1].m_data + 1),mat);
    tcu::Matrix<double,_2,_2>::operator=
              ((Matrix<double,_2,_2> *)(matrix_b.m_data.m_data[1].m_data + 1),&local_c8);
    tcu::Matrix<double,_2,_2>::~Matrix(&local_c8);
    tcu::transpose<double,2,2>(&local_e8,(tcu *)local_78,mat_00);
    tcu::Matrix<double,_2,_2>::operator=((Matrix<double,_2,_2> *)local_78,&local_e8);
    tcu::Matrix<double,_2,_2>::~Matrix(&local_e8);
    tcu::operator*(&local_108,(Matrix<double,_2,_2> *)(matrix_b.m_data.m_data[1].m_data + 1),
                   (Matrix<double,_2,_2> *)local_78);
    tcu::Matrix<double,_2,_2>::operator=((Matrix<double,_2,_2> *)local_a8,&local_108);
    tcu::Matrix<double,_2,_2>::~Matrix(&local_108);
    tcu::Matrix<double,_2,_2>::getColumnMajorData
              ((Array<double,_4> *)(matrix_a_1.m_data.m_data[2].m_data + 1),
               (Matrix<double,_2,_2> *)local_a8);
    pdVar2 = tcu::Array<double,_4>::getPtr
                       ((Array<double,_4> *)(matrix_a_1.m_data.m_data[2].m_data + 1));
    *out_result_ptr = *pdVar2;
    out_result_ptr[1] = pdVar2[1];
    out_result_ptr[2] = pdVar2[2];
    out_result_ptr[3] = pdVar2[3];
    tcu::Array<double,_4>::~Array((Array<double,_4> *)(matrix_a_1.m_data.m_data[2].m_data + 1));
    tcu::Matrix<double,_2,_2>::~Matrix((Matrix<double,_2,_2> *)local_a8);
    tcu::Matrix<double,_2,_2>::~Matrix((Matrix<double,_2,_2> *)local_78);
    tcu::Matrix<double,_2,_2>::~Matrix
              ((Matrix<double,_2,_2> *)(matrix_b.m_data.m_data[1].m_data + 1));
    break;
  case VARIABLE_TYPE_DMAT2X3:
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](matrix_a_data,0);
    tcu::Matrix<double,_2,_3>::Matrix
              ((Matrix<double,_2,_3> *)(matrix_a_transposed.m_data.m_data[1].m_data + 2),pvVar1);
    tcu::Matrix<double,_3,_2>::Matrix
              ((Matrix<double,_3,_2> *)(matrix_b_1.m_data.m_data[1].m_data + 2));
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](matrix_b_data,0);
    tcu::Matrix<double,_3,_2>::Matrix
              ((Matrix<double,_3,_2> *)(matrix_b_transposed.m_data.m_data[2].m_data + 1),pvVar1);
    tcu::Matrix<double,_2,_3>::Matrix
              ((Matrix<double,_2,_3> *)(result_1.m_data.m_data[2].m_data + 2));
    tcu::Matrix<double,_3,_3>::Matrix((Matrix<double,_3,_3> *)local_230);
    tcu::transpose<double,2,3>
              (&local_260,(tcu *)(matrix_a_transposed.m_data.m_data[1].m_data + 2),mat_01);
    tcu::Matrix<double,_3,_2>::operator=
              ((Matrix<double,_3,_2> *)(matrix_b_1.m_data.m_data[1].m_data + 2),&local_260);
    tcu::Matrix<double,_3,_2>::~Matrix(&local_260);
    tcu::transpose<double,3,2>
              (&local_290,(tcu *)(matrix_b_transposed.m_data.m_data[2].m_data + 1),mat_02);
    tcu::Matrix<double,_2,_3>::operator=
              ((Matrix<double,_2,_3> *)(result_1.m_data.m_data[2].m_data + 2),&local_290);
    tcu::Matrix<double,_2,_3>::~Matrix(&local_290);
    tcu::operator*(&local_2d8,(Matrix<double,_3,_2> *)(matrix_b_1.m_data.m_data[1].m_data + 2),
                   (Matrix<double,_2,_3> *)(result_1.m_data.m_data[2].m_data + 2));
    tcu::Matrix<double,_3,_3>::operator=((Matrix<double,_3,_3> *)local_230,&local_2d8);
    tcu::Matrix<double,_3,_3>::~Matrix(&local_2d8);
    tcu::Matrix<double,_3,_3>::getColumnMajorData
              ((Array<double,_9> *)(matrix_a_2.m_data.m_data[3].m_data + 1),
               (Matrix<double,_3,_3> *)local_230);
    pdVar2 = tcu::Array<double,_9>::getPtr
                       ((Array<double,_9> *)(matrix_a_2.m_data.m_data[3].m_data + 1));
    memcpy(out_result_ptr,pdVar2,0x48);
    tcu::Array<double,_9>::~Array((Array<double,_9> *)(matrix_a_2.m_data.m_data[3].m_data + 1));
    tcu::Matrix<double,_3,_3>::~Matrix((Matrix<double,_3,_3> *)local_230);
    tcu::Matrix<double,_2,_3>::~Matrix
              ((Matrix<double,_2,_3> *)(result_1.m_data.m_data[2].m_data + 2));
    tcu::Matrix<double,_3,_2>::~Matrix
              ((Matrix<double,_3,_2> *)(matrix_b_transposed.m_data.m_data[2].m_data + 1));
    tcu::Matrix<double,_3,_2>::~Matrix
              ((Matrix<double,_3,_2> *)(matrix_b_1.m_data.m_data[1].m_data + 2));
    tcu::Matrix<double,_2,_3>::~Matrix
              ((Matrix<double,_2,_3> *)(matrix_a_transposed.m_data.m_data[1].m_data + 2));
    break;
  case VARIABLE_TYPE_DMAT2X4:
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](matrix_a_data,0);
    tcu::Matrix<double,_2,_4>::Matrix
              ((Matrix<double,_2,_4> *)(matrix_a_transposed_1.m_data.m_data[1].m_data + 3),pvVar1);
    tcu::Matrix<double,_4,_2>::Matrix
              ((Matrix<double,_4,_2> *)(matrix_b_2.m_data.m_data[1].m_data + 3));
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](matrix_b_data,0);
    tcu::Matrix<double,_4,_2>::Matrix
              ((Matrix<double,_4,_2> *)(matrix_b_transposed_1.m_data.m_data[3].m_data + 1),pvVar1);
    tcu::Matrix<double,_2,_4>::Matrix
              ((Matrix<double,_2,_4> *)(result_2.m_data.m_data[3].m_data + 3));
    tcu::Matrix<double,_4,_4>::Matrix((Matrix<double,_4,_4> *)local_4a0);
    tcu::transpose<double,2,4>
              (&local_4e0,(tcu *)(matrix_a_transposed_1.m_data.m_data[1].m_data + 3),mat_03);
    tcu::Matrix<double,_4,_2>::operator=
              ((Matrix<double,_4,_2> *)(matrix_b_2.m_data.m_data[1].m_data + 3),&local_4e0);
    tcu::Matrix<double,_4,_2>::~Matrix(&local_4e0);
    tcu::transpose<double,4,2>
              (&local_520,(tcu *)(matrix_b_transposed_1.m_data.m_data[3].m_data + 1),mat_04);
    tcu::Matrix<double,_2,_4>::operator=
              ((Matrix<double,_2,_4> *)(result_2.m_data.m_data[3].m_data + 3),&local_520);
    tcu::Matrix<double,_2,_4>::~Matrix(&local_520);
    tcu::operator*(&local_5a0,(Matrix<double,_4,_2> *)(matrix_b_2.m_data.m_data[1].m_data + 3),
                   (Matrix<double,_2,_4> *)(result_2.m_data.m_data[3].m_data + 3));
    tcu::Matrix<double,_4,_4>::operator=((Matrix<double,_4,_4> *)local_4a0,&local_5a0);
    tcu::Matrix<double,_4,_4>::~Matrix(&local_5a0);
    tcu::Matrix<double,_4,_4>::getColumnMajorData
              ((Array<double,_16> *)(matrix_a_3.m_data.m_data[2].m_data + 2),
               (Matrix<double,_4,_4> *)local_4a0);
    pdVar2 = tcu::Array<double,_16>::getPtr
                       ((Array<double,_16> *)(matrix_a_3.m_data.m_data[2].m_data + 2));
    memcpy(out_result_ptr,pdVar2,0x80);
    tcu::Array<double,_16>::~Array((Array<double,_16> *)(matrix_a_3.m_data.m_data[2].m_data + 2));
    tcu::Matrix<double,_4,_4>::~Matrix((Matrix<double,_4,_4> *)local_4a0);
    tcu::Matrix<double,_2,_4>::~Matrix
              ((Matrix<double,_2,_4> *)(result_2.m_data.m_data[3].m_data + 3));
    tcu::Matrix<double,_4,_2>::~Matrix
              ((Matrix<double,_4,_2> *)(matrix_b_transposed_1.m_data.m_data[3].m_data + 1));
    tcu::Matrix<double,_4,_2>::~Matrix
              ((Matrix<double,_4,_2> *)(matrix_b_2.m_data.m_data[1].m_data + 3));
    tcu::Matrix<double,_2,_4>::~Matrix
              ((Matrix<double,_2,_4> *)(matrix_a_transposed_1.m_data.m_data[1].m_data + 3));
    break;
  case VARIABLE_TYPE_DMAT3:
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](matrix_a_data,0);
    tcu::Matrix<double,_3,_3>::Matrix
              ((Matrix<double,_3,_3> *)(matrix_b_3.m_data.m_data[2].m_data + 2),pvVar1);
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](matrix_b_data,0);
    tcu::Matrix<double,_3,_3>::Matrix
              ((Matrix<double,_3,_3> *)(result_3.m_data.m_data[2].m_data + 2),pvVar1);
    tcu::Matrix<double,_3,_3>::Matrix((Matrix<double,_3,_3> *)local_6f8);
    tcu::transpose<double,3,3>(&local_740,(tcu *)(matrix_b_3.m_data.m_data[2].m_data + 2),mat_05);
    tcu::Matrix<double,_3,_3>::operator=
              ((Matrix<double,_3,_3> *)(matrix_b_3.m_data.m_data[2].m_data + 2),&local_740);
    tcu::Matrix<double,_3,_3>::~Matrix(&local_740);
    tcu::transpose<double,3,3>(&local_788,(tcu *)(result_3.m_data.m_data[2].m_data + 2),mat_06);
    tcu::Matrix<double,_3,_3>::operator=
              ((Matrix<double,_3,_3> *)(result_3.m_data.m_data[2].m_data + 2),&local_788);
    tcu::Matrix<double,_3,_3>::~Matrix(&local_788);
    tcu::operator*(&local_7d0,(Matrix<double,_3,_3> *)(matrix_b_3.m_data.m_data[2].m_data + 2),
                   (Matrix<double,_3,_3> *)(result_3.m_data.m_data[2].m_data + 2));
    tcu::Matrix<double,_3,_3>::operator=((Matrix<double,_3,_3> *)local_6f8,&local_7d0);
    tcu::Matrix<double,_3,_3>::~Matrix(&local_7d0);
    tcu::Matrix<double,_3,_3>::getColumnMajorData
              ((Array<double,_9> *)(matrix_a_4.m_data.m_data[1].m_data + 2),
               (Matrix<double,_3,_3> *)local_6f8);
    pdVar2 = tcu::Array<double,_9>::getPtr
                       ((Array<double,_9> *)(matrix_a_4.m_data.m_data[1].m_data + 2));
    memcpy(out_result_ptr,pdVar2,0x48);
    tcu::Array<double,_9>::~Array((Array<double,_9> *)(matrix_a_4.m_data.m_data[1].m_data + 2));
    tcu::Matrix<double,_3,_3>::~Matrix((Matrix<double,_3,_3> *)local_6f8);
    tcu::Matrix<double,_3,_3>::~Matrix
              ((Matrix<double,_3,_3> *)(result_3.m_data.m_data[2].m_data + 2));
    tcu::Matrix<double,_3,_3>::~Matrix
              ((Matrix<double,_3,_3> *)(matrix_b_3.m_data.m_data[2].m_data + 2));
    break;
  case VARIABLE_TYPE_DMAT3X2:
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](matrix_a_data,0);
    tcu::Matrix<double,_3,_2>::Matrix
              ((Matrix<double,_3,_2> *)(matrix_a_transposed_2.m_data.m_data[2].m_data + 1),pvVar1);
    tcu::Matrix<double,_2,_3>::Matrix
              ((Matrix<double,_2,_3> *)(matrix_b_4.m_data.m_data[2].m_data + 1));
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](matrix_b_data,0);
    tcu::Matrix<double,_2,_3>::Matrix
              ((Matrix<double,_2,_3> *)(matrix_b_transposed_2.m_data.m_data[1].m_data + 2),pvVar1);
    tcu::Matrix<double,_3,_2>::Matrix
              ((Matrix<double,_3,_2> *)(result_4.m_data.m_data[1].m_data + 1));
    tcu::Matrix<double,_2,_2>::Matrix((Matrix<double,_2,_2> *)local_8f8);
    tcu::transpose<double,3,2>
              (&local_928,(tcu *)(matrix_a_transposed_2.m_data.m_data[2].m_data + 1),mat_07);
    tcu::Matrix<double,_2,_3>::operator=
              ((Matrix<double,_2,_3> *)(matrix_b_4.m_data.m_data[2].m_data + 1),&local_928);
    tcu::Matrix<double,_2,_3>::~Matrix(&local_928);
    tcu::transpose<double,2,3>
              (&local_958,(tcu *)(matrix_b_transposed_2.m_data.m_data[1].m_data + 2),mat_08);
    tcu::Matrix<double,_3,_2>::operator=
              ((Matrix<double,_3,_2> *)(result_4.m_data.m_data[1].m_data + 1),&local_958);
    tcu::Matrix<double,_3,_2>::~Matrix(&local_958);
    tcu::operator*(&local_978,(Matrix<double,_2,_3> *)(matrix_b_4.m_data.m_data[2].m_data + 1),
                   (Matrix<double,_3,_2> *)(result_4.m_data.m_data[1].m_data + 1));
    tcu::Matrix<double,_2,_2>::operator=((Matrix<double,_2,_2> *)local_8f8,&local_978);
    tcu::Matrix<double,_2,_2>::~Matrix(&local_978);
    tcu::Matrix<double,_2,_2>::getColumnMajorData
              ((Array<double,_4> *)(matrix_a_5.m_data.m_data[3].m_data + 2),
               (Matrix<double,_2,_2> *)local_8f8);
    pdVar2 = tcu::Array<double,_4>::getPtr
                       ((Array<double,_4> *)(matrix_a_5.m_data.m_data[3].m_data + 2));
    *out_result_ptr = *pdVar2;
    out_result_ptr[1] = pdVar2[1];
    out_result_ptr[2] = pdVar2[2];
    out_result_ptr[3] = pdVar2[3];
    tcu::Array<double,_4>::~Array((Array<double,_4> *)(matrix_a_5.m_data.m_data[3].m_data + 2));
    tcu::Matrix<double,_2,_2>::~Matrix((Matrix<double,_2,_2> *)local_8f8);
    tcu::Matrix<double,_3,_2>::~Matrix
              ((Matrix<double,_3,_2> *)(result_4.m_data.m_data[1].m_data + 1));
    tcu::Matrix<double,_2,_3>::~Matrix
              ((Matrix<double,_2,_3> *)(matrix_b_transposed_2.m_data.m_data[1].m_data + 2));
    tcu::Matrix<double,_2,_3>::~Matrix
              ((Matrix<double,_2,_3> *)(matrix_b_4.m_data.m_data[2].m_data + 1));
    tcu::Matrix<double,_3,_2>::~Matrix
              ((Matrix<double,_3,_2> *)(matrix_a_transposed_2.m_data.m_data[2].m_data + 1));
    break;
  case VARIABLE_TYPE_DMAT3X4:
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](matrix_a_data,0);
    tcu::Matrix<double,_3,_4>::Matrix
              ((Matrix<double,_3,_4> *)(matrix_a_transposed_3.m_data.m_data[2].m_data + 3),pvVar1);
    tcu::Matrix<double,_4,_3>::Matrix
              ((Matrix<double,_4,_3> *)(matrix_b_5.m_data.m_data[2].m_data + 3));
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](matrix_b_data,0);
    tcu::Matrix<double,_4,_3>::Matrix
              ((Matrix<double,_4,_3> *)(matrix_b_transposed_3.m_data.m_data[3].m_data + 2),pvVar1);
    tcu::Matrix<double,_3,_4>::Matrix
              ((Matrix<double,_3,_4> *)(result_5.m_data.m_data[3].m_data + 3));
    tcu::Matrix<double,_4,_4>::Matrix((Matrix<double,_4,_4> *)local_b98);
    tcu::transpose<double,3,4>
              (&local_bf8,(tcu *)(matrix_a_transposed_3.m_data.m_data[2].m_data + 3),mat_09);
    tcu::Matrix<double,_4,_3>::operator=
              ((Matrix<double,_4,_3> *)(matrix_b_5.m_data.m_data[2].m_data + 3),&local_bf8);
    tcu::Matrix<double,_4,_3>::~Matrix(&local_bf8);
    tcu::transpose<double,4,3>
              (&local_c58,(tcu *)(matrix_b_transposed_3.m_data.m_data[3].m_data + 2),mat_10);
    tcu::Matrix<double,_3,_4>::operator=
              ((Matrix<double,_3,_4> *)(result_5.m_data.m_data[3].m_data + 3),&local_c58);
    tcu::Matrix<double,_3,_4>::~Matrix(&local_c58);
    tcu::operator*(&local_cd8,(Matrix<double,_4,_3> *)(matrix_b_5.m_data.m_data[2].m_data + 3),
                   (Matrix<double,_3,_4> *)(result_5.m_data.m_data[3].m_data + 3));
    tcu::Matrix<double,_4,_4>::operator=((Matrix<double,_4,_4> *)local_b98,&local_cd8);
    tcu::Matrix<double,_4,_4>::~Matrix(&local_cd8);
    tcu::Matrix<double,_4,_4>::getColumnMajorData
              ((Array<double,_16> *)(matrix_a_6.m_data.m_data[3].m_data + 3),
               (Matrix<double,_4,_4> *)local_b98);
    pdVar2 = tcu::Array<double,_16>::getPtr
                       ((Array<double,_16> *)(matrix_a_6.m_data.m_data[3].m_data + 3));
    memcpy(out_result_ptr,pdVar2,0x80);
    tcu::Array<double,_16>::~Array((Array<double,_16> *)(matrix_a_6.m_data.m_data[3].m_data + 3));
    tcu::Matrix<double,_4,_4>::~Matrix((Matrix<double,_4,_4> *)local_b98);
    tcu::Matrix<double,_3,_4>::~Matrix
              ((Matrix<double,_3,_4> *)(result_5.m_data.m_data[3].m_data + 3));
    tcu::Matrix<double,_4,_3>::~Matrix
              ((Matrix<double,_4,_3> *)(matrix_b_transposed_3.m_data.m_data[3].m_data + 2));
    tcu::Matrix<double,_4,_3>::~Matrix
              ((Matrix<double,_4,_3> *)(matrix_b_5.m_data.m_data[2].m_data + 3));
    tcu::Matrix<double,_3,_4>::~Matrix
              ((Matrix<double,_3,_4> *)(matrix_a_transposed_3.m_data.m_data[2].m_data + 3));
    break;
  case VARIABLE_TYPE_DMAT4:
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](matrix_a_data,0);
    tcu::Matrix<double,_4,_4>::Matrix
              ((Matrix<double,_4,_4> *)(matrix_b_6.m_data.m_data[3].m_data + 3),pvVar1);
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](matrix_b_data,0);
    tcu::Matrix<double,_4,_4>::Matrix
              ((Matrix<double,_4,_4> *)(result_6.m_data.m_data[3].m_data + 3),pvVar1);
    tcu::Matrix<double,_4,_4>::Matrix((Matrix<double,_4,_4> *)local_ed8);
    tcu::transpose<double,4,4>(&local_f58,(tcu *)(matrix_b_6.m_data.m_data[3].m_data + 3),mat_11);
    tcu::Matrix<double,_4,_4>::operator=
              ((Matrix<double,_4,_4> *)(matrix_b_6.m_data.m_data[3].m_data + 3),&local_f58);
    tcu::Matrix<double,_4,_4>::~Matrix(&local_f58);
    tcu::transpose<double,4,4>(&local_fd8,(tcu *)(result_6.m_data.m_data[3].m_data + 3),mat_12);
    tcu::Matrix<double,_4,_4>::operator=
              ((Matrix<double,_4,_4> *)(result_6.m_data.m_data[3].m_data + 3),&local_fd8);
    tcu::Matrix<double,_4,_4>::~Matrix(&local_fd8);
    tcu::operator*(&local_1058,(Matrix<double,_4,_4> *)(matrix_b_6.m_data.m_data[3].m_data + 3),
                   (Matrix<double,_4,_4> *)(result_6.m_data.m_data[3].m_data + 3));
    tcu::Matrix<double,_4,_4>::operator=((Matrix<double,_4,_4> *)local_ed8,&local_1058);
    tcu::Matrix<double,_4,_4>::~Matrix(&local_1058);
    tcu::Matrix<double,_4,_4>::getColumnMajorData
              ((Array<double,_16> *)(matrix_a_7.m_data.m_data[1].m_data + 3),
               (Matrix<double,_4,_4> *)local_ed8);
    pdVar2 = tcu::Array<double,_16>::getPtr
                       ((Array<double,_16> *)(matrix_a_7.m_data.m_data[1].m_data + 3));
    memcpy(out_result_ptr,pdVar2,0x80);
    tcu::Array<double,_16>::~Array((Array<double,_16> *)(matrix_a_7.m_data.m_data[1].m_data + 3));
    tcu::Matrix<double,_4,_4>::~Matrix((Matrix<double,_4,_4> *)local_ed8);
    tcu::Matrix<double,_4,_4>::~Matrix
              ((Matrix<double,_4,_4> *)(result_6.m_data.m_data[3].m_data + 3));
    tcu::Matrix<double,_4,_4>::~Matrix
              ((Matrix<double,_4,_4> *)(matrix_b_6.m_data.m_data[3].m_data + 3));
    break;
  case VARIABLE_TYPE_DMAT4X2:
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](matrix_a_data,0);
    tcu::Matrix<double,_4,_2>::Matrix
              ((Matrix<double,_4,_2> *)(matrix_a_transposed_4.m_data.m_data[3].m_data + 1),pvVar1);
    tcu::Matrix<double,_2,_4>::Matrix
              ((Matrix<double,_2,_4> *)(matrix_b_7.m_data.m_data[3].m_data + 1));
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](matrix_b_data,0);
    tcu::Matrix<double,_2,_4>::Matrix
              ((Matrix<double,_2,_4> *)(matrix_b_transposed_4.m_data.m_data[1].m_data + 3),pvVar1);
    tcu::Matrix<double,_4,_2>::Matrix
              ((Matrix<double,_4,_2> *)(result_7.m_data.m_data[1].m_data + 1));
    tcu::Matrix<double,_2,_2>::Matrix((Matrix<double,_2,_2> *)local_11f8);
    tcu::transpose<double,4,2>
              (&local_1238,(tcu *)(matrix_a_transposed_4.m_data.m_data[3].m_data + 1),mat_13);
    tcu::Matrix<double,_2,_4>::operator=
              ((Matrix<double,_2,_4> *)(matrix_b_7.m_data.m_data[3].m_data + 1),&local_1238);
    tcu::Matrix<double,_2,_4>::~Matrix(&local_1238);
    tcu::transpose<double,2,4>
              (&local_1278,(tcu *)(matrix_b_transposed_4.m_data.m_data[1].m_data + 3),mat_14);
    tcu::Matrix<double,_4,_2>::operator=
              ((Matrix<double,_4,_2> *)(result_7.m_data.m_data[1].m_data + 1),&local_1278);
    tcu::Matrix<double,_4,_2>::~Matrix(&local_1278);
    tcu::operator*(&local_1298,(Matrix<double,_2,_4> *)(matrix_b_7.m_data.m_data[3].m_data + 1),
                   (Matrix<double,_4,_2> *)(result_7.m_data.m_data[1].m_data + 1));
    tcu::Matrix<double,_2,_2>::operator=((Matrix<double,_2,_2> *)local_11f8,&local_1298);
    tcu::Matrix<double,_2,_2>::~Matrix(&local_1298);
    tcu::Matrix<double,_2,_2>::getColumnMajorData
              ((Array<double,_4> *)(matrix_a_8.m_data.m_data[2].m_data + 3),
               (Matrix<double,_2,_2> *)local_11f8);
    pdVar2 = tcu::Array<double,_4>::getPtr
                       ((Array<double,_4> *)(matrix_a_8.m_data.m_data[2].m_data + 3));
    *out_result_ptr = *pdVar2;
    out_result_ptr[1] = pdVar2[1];
    out_result_ptr[2] = pdVar2[2];
    out_result_ptr[3] = pdVar2[3];
    tcu::Array<double,_4>::~Array((Array<double,_4> *)(matrix_a_8.m_data.m_data[2].m_data + 3));
    tcu::Matrix<double,_2,_2>::~Matrix((Matrix<double,_2,_2> *)local_11f8);
    tcu::Matrix<double,_4,_2>::~Matrix
              ((Matrix<double,_4,_2> *)(result_7.m_data.m_data[1].m_data + 1));
    tcu::Matrix<double,_2,_4>::~Matrix
              ((Matrix<double,_2,_4> *)(matrix_b_transposed_4.m_data.m_data[1].m_data + 3));
    tcu::Matrix<double,_2,_4>::~Matrix
              ((Matrix<double,_2,_4> *)(matrix_b_7.m_data.m_data[3].m_data + 1));
    tcu::Matrix<double,_4,_2>::~Matrix
              ((Matrix<double,_4,_2> *)(matrix_a_transposed_4.m_data.m_data[3].m_data + 1));
    break;
  case VARIABLE_TYPE_DMAT4X3:
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](matrix_a_data,0);
    tcu::Matrix<double,_4,_3>::Matrix
              ((Matrix<double,_4,_3> *)(matrix_a_transposed_5.m_data.m_data[3].m_data + 2),pvVar1);
    tcu::Matrix<double,_3,_4>::Matrix
              ((Matrix<double,_3,_4> *)(matrix_b_8.m_data.m_data[3].m_data + 2));
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](matrix_b_data,0);
    tcu::Matrix<double,_3,_4>::Matrix
              ((Matrix<double,_3,_4> *)(matrix_b_transposed_5.m_data.m_data[2].m_data + 3),pvVar1);
    tcu::Matrix<double,_4,_3>::Matrix
              ((Matrix<double,_4,_3> *)(result_8.m_data.m_data[2].m_data + 2));
    tcu::Matrix<double,_3,_3>::Matrix((Matrix<double,_3,_3> *)local_1480);
    tcu::transpose<double,4,3>
              (&local_14e0,(tcu *)(matrix_a_transposed_5.m_data.m_data[3].m_data + 2),mat_15);
    tcu::Matrix<double,_3,_4>::operator=
              ((Matrix<double,_3,_4> *)(matrix_b_8.m_data.m_data[3].m_data + 2),&local_14e0);
    tcu::Matrix<double,_3,_4>::~Matrix(&local_14e0);
    tcu::transpose<double,3,4>
              (&local_1540,(tcu *)(matrix_b_transposed_5.m_data.m_data[2].m_data + 3),mat_16);
    tcu::Matrix<double,_4,_3>::operator=
              ((Matrix<double,_4,_3> *)(result_8.m_data.m_data[2].m_data + 2),&local_1540);
    tcu::Matrix<double,_4,_3>::~Matrix(&local_1540);
    tcu::operator*(&local_1588,(Matrix<double,_3,_4> *)(matrix_b_8.m_data.m_data[3].m_data + 2),
                   (Matrix<double,_4,_3> *)(result_8.m_data.m_data[2].m_data + 2));
    tcu::Matrix<double,_3,_3>::operator=((Matrix<double,_3,_3> *)local_1480,&local_1588);
    tcu::Matrix<double,_3,_3>::~Matrix(&local_1588);
    tcu::Matrix<double,_3,_3>::getColumnMajorData(&local_15d0,(Matrix<double,_3,_3> *)local_1480);
    pdVar2 = tcu::Array<double,_9>::getPtr(&local_15d0);
    memcpy(out_result_ptr,pdVar2,0x48);
    tcu::Array<double,_9>::~Array(&local_15d0);
    tcu::Matrix<double,_3,_3>::~Matrix((Matrix<double,_3,_3> *)local_1480);
    tcu::Matrix<double,_4,_3>::~Matrix
              ((Matrix<double,_4,_3> *)(result_8.m_data.m_data[2].m_data + 2));
    tcu::Matrix<double,_3,_4>::~Matrix
              ((Matrix<double,_3,_4> *)(matrix_b_transposed_5.m_data.m_data[2].m_data + 3));
    tcu::Matrix<double,_3,_4>::~Matrix
              ((Matrix<double,_3,_4> *)(matrix_b_8.m_data.m_data[3].m_data + 2));
    tcu::Matrix<double,_4,_3>::~Matrix
              ((Matrix<double,_4,_3> *)(matrix_a_transposed_5.m_data.m_data[3].m_data + 2));
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Unrecognized matrix A type",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
               ,0x2c2e);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return;
}

Assistant:

void GPUShaderFP64Test9::getMatrixMultiplicationResult(const Utils::_variable_type& matrix_a_type,
													   const std::vector<double>&   matrix_a_data,
													   const Utils::_variable_type& matrix_b_type,
													   const std::vector<double>& matrix_b_data, double* out_result_ptr)
{
	(void)matrix_b_type;
	using namespace tcu;
	/* To keep the code maintainable, we only consider cases relevant for this test */
	switch (matrix_a_type)
	{
	case Utils::VARIABLE_TYPE_DMAT2:
	{
		DE_ASSERT(matrix_b_type == Utils::VARIABLE_TYPE_DMAT2);

		tcu::Matrix2d matrix_a(&matrix_a_data[0]);
		tcu::Matrix2d matrix_b(&matrix_b_data[0]);
		tcu::Matrix2d result;

		matrix_a = transpose(matrix_a);
		matrix_b = transpose(matrix_b);
		result   = matrix_a * matrix_b;

		memcpy(out_result_ptr, result.getColumnMajorData().getPtr(), sizeof(double) * 2 * 2);
		break;
	}

	case Utils::VARIABLE_TYPE_DMAT2X3:
	{
		DE_ASSERT(matrix_b_type == Utils::VARIABLE_TYPE_DMAT3X2);

		tcu::Matrix<double, 2, 3> matrix_a(&matrix_a_data[0]);
		tcu::Matrix<double, 3, 2> matrix_a_transposed;
		tcu::Matrix<double, 3, 2> matrix_b(&matrix_b_data[0]);
		tcu::Matrix<double, 2, 3> matrix_b_transposed;
		tcu::Matrix<double, 3, 3> result;

		matrix_a_transposed = transpose(matrix_a);
		matrix_b_transposed = transpose(matrix_b);
		result				= matrix_a_transposed * matrix_b_transposed;

		memcpy(out_result_ptr, result.getColumnMajorData().getPtr(), sizeof(double) * 3 * 3);
		break;
	}

	case Utils::VARIABLE_TYPE_DMAT2X4:
	{
		DE_ASSERT(matrix_b_type == Utils::VARIABLE_TYPE_DMAT4X2);

		tcu::Matrix<double, 2, 4> matrix_a(&matrix_a_data[0]);
		tcu::Matrix<double, 4, 2> matrix_a_transposed;
		tcu::Matrix<double, 4, 2> matrix_b(&matrix_b_data[0]);
		tcu::Matrix<double, 2, 4> matrix_b_transposed;
		tcu::Matrix<double, 4, 4> result;

		matrix_a_transposed = transpose(matrix_a);
		matrix_b_transposed = transpose(matrix_b);
		result				= matrix_a_transposed * matrix_b_transposed;

		memcpy(out_result_ptr, result.getColumnMajorData().getPtr(), sizeof(double) * 4 * 4);
		break;
	}

	case Utils::VARIABLE_TYPE_DMAT3:
	{
		DE_ASSERT(matrix_b_type == Utils::VARIABLE_TYPE_DMAT3);

		tcu::Matrix<double, 3, 3> matrix_a(&matrix_a_data[0]);
		tcu::Matrix<double, 3, 3> matrix_b(&matrix_b_data[0]);
		tcu::Matrix<double, 3, 3> result;

		matrix_a = transpose(matrix_a);
		matrix_b = transpose(matrix_b);
		result   = matrix_a * matrix_b;

		memcpy(out_result_ptr, result.getColumnMajorData().getPtr(), sizeof(double) * 3 * 3);
		break;
	}

	case Utils::VARIABLE_TYPE_DMAT3X2:
	{
		DE_ASSERT(matrix_b_type == Utils::VARIABLE_TYPE_DMAT2X3);

		tcu::Matrix<double, 3, 2> matrix_a(&matrix_a_data[0]);
		tcu::Matrix<double, 2, 3> matrix_a_transposed;
		tcu::Matrix<double, 2, 3> matrix_b(&matrix_b_data[0]);
		tcu::Matrix<double, 3, 2> matrix_b_transposed;
		tcu::Matrix<double, 2, 2> result;

		matrix_a_transposed = transpose(matrix_a);
		matrix_b_transposed = transpose(matrix_b);
		result				= matrix_a_transposed * matrix_b_transposed;

		memcpy(out_result_ptr, result.getColumnMajorData().getPtr(), sizeof(double) * 2 * 2);
		break;
	}

	case Utils::VARIABLE_TYPE_DMAT3X4:
	{
		DE_ASSERT(matrix_b_type == Utils::VARIABLE_TYPE_DMAT4X3);

		tcu::Matrix<double, 3, 4> matrix_a(&matrix_a_data[0]);
		tcu::Matrix<double, 4, 3> matrix_a_transposed;
		tcu::Matrix<double, 4, 3> matrix_b(&matrix_b_data[0]);
		tcu::Matrix<double, 3, 4> matrix_b_transposed;
		tcu::Matrix<double, 4, 4> result;

		matrix_a_transposed = transpose(matrix_a);
		matrix_b_transposed = transpose(matrix_b);
		result				= matrix_a_transposed * matrix_b_transposed;

		memcpy(out_result_ptr, result.getColumnMajorData().getPtr(), sizeof(double) * 4 * 4);
		break;
	}

	case Utils::VARIABLE_TYPE_DMAT4:
	{
		DE_ASSERT(matrix_b_type == Utils::VARIABLE_TYPE_DMAT4);

		tcu::Matrix<double, 4, 4> matrix_a(&matrix_a_data[0]);
		tcu::Matrix<double, 4, 4> matrix_b(&matrix_b_data[0]);
		tcu::Matrix<double, 4, 4> result;

		matrix_a = transpose(matrix_a);
		matrix_b = transpose(matrix_b);
		result   = matrix_a * matrix_b;

		memcpy(out_result_ptr, result.getColumnMajorData().getPtr(), sizeof(double) * 4 * 4);
		break;
	}

	case Utils::VARIABLE_TYPE_DMAT4X2:
	{
		DE_ASSERT(matrix_b_type == Utils::VARIABLE_TYPE_DMAT2X4);

		tcu::Matrix<double, 4, 2> matrix_a(&matrix_a_data[0]);
		tcu::Matrix<double, 2, 4> matrix_a_transposed;
		tcu::Matrix<double, 2, 4> matrix_b(&matrix_b_data[0]);
		tcu::Matrix<double, 4, 2> matrix_b_transposed;
		tcu::Matrix<double, 2, 2> result;

		matrix_a_transposed = transpose(matrix_a);
		matrix_b_transposed = transpose(matrix_b);
		result				= matrix_a_transposed * matrix_b_transposed;

		memcpy(out_result_ptr, result.getColumnMajorData().getPtr(), sizeof(double) * 2 * 2);
		break;
	}

	case Utils::VARIABLE_TYPE_DMAT4X3:
	{
		DE_ASSERT(matrix_b_type == Utils::VARIABLE_TYPE_DMAT3X4);

		tcu::Matrix<double, 4, 3> matrix_a(&matrix_a_data[0]);
		tcu::Matrix<double, 3, 4> matrix_a_transposed;
		tcu::Matrix<double, 3, 4> matrix_b(&matrix_b_data[0]);
		tcu::Matrix<double, 4, 3> matrix_b_transposed;
		tcu::Matrix<double, 3, 3> result;

		matrix_a_transposed = transpose(matrix_a);
		matrix_b_transposed = transpose(matrix_b);
		result				= matrix_a_transposed * matrix_b_transposed;

		memcpy(out_result_ptr, result.getColumnMajorData().getPtr(), sizeof(double) * 3 * 3);
		break;
	}

	default:
	{
		TCU_FAIL("Unrecognized matrix A type");
	}
	} /* switch (matrix_a_type) */
}